

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O3

void asio::detail::
     executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  scheduler_operation *psVar1;
  impl_base *i;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_29;
  ptr local_28;
  
  local_28.a = &local_29;
  psVar1 = base[1].next_;
  base[1].next_ = (scheduler_operation *)0x0;
  local_28.v = base;
  local_28.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)base;
  ptr::reset(&local_28);
  if (owner == (void *)0x0) {
    if (psVar1 != (scheduler_operation *)0x0) {
      (*(code *)psVar1->next_)(psVar1,0);
    }
  }
  else if (psVar1 != (scheduler_operation *)0x0) {
    (*(code *)psVar1->next_)(psVar1,1);
  }
  ptr::reset(&local_28);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }